

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O3

BoxList * __thiscall amrex::BoxList::removeEmpty(BoxList *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer pBVar4;
  pointer pBVar5;
  pointer pBVar6;
  long lVar7;
  long lVar8;
  
  pBVar6 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar4 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar8 = (long)pBVar4 - (long)pBVar6;
  lVar7 = (lVar8 >> 2) * 0x6db6db6db6db6db7 >> 2;
  if (0 < lVar7) {
    lVar8 = lVar7 + 1;
    pBVar5 = pBVar6 + 2;
    do {
      if ((((pBVar5[-2].bigend.vect[0] < pBVar5[-2].smallend.vect[0]) ||
           (pBVar5[-2].bigend.vect[1] < pBVar5[-2].smallend.vect[1])) ||
          (pBVar5[-2].bigend.vect[2] < pBVar5[-2].smallend.vect[2])) || (7 < pBVar5[-2].btype.itype)
         ) {
        pBVar5 = pBVar5 + -2;
        goto LAB_00450625;
      }
      if (((pBVar5[-1].bigend.vect[0] < pBVar5[-1].smallend.vect[0]) ||
          (pBVar5[-1].bigend.vect[1] < pBVar5[-1].smallend.vect[1])) ||
         ((pBVar5[-1].bigend.vect[2] < pBVar5[-1].smallend.vect[2] || (7 < pBVar5[-1].btype.itype)))
         ) {
        pBVar5 = pBVar5 + -1;
        goto LAB_00450625;
      }
      if ((((pBVar5->bigend).vect[0] < (pBVar5->smallend).vect[0]) ||
          ((pBVar5->bigend).vect[1] < (pBVar5->smallend).vect[1])) ||
         (((pBVar5->bigend).vect[2] < (pBVar5->smallend).vect[2] || (7 < (pBVar5->btype).itype))))
      goto LAB_00450625;
      if ((((pBVar5[1].bigend.vect[0] < pBVar5[1].smallend.vect[0]) ||
           (pBVar5[1].bigend.vect[1] < pBVar5[1].smallend.vect[1])) ||
          (pBVar5[1].bigend.vect[2] < pBVar5[1].smallend.vect[2])) || (7 < pBVar5[1].btype.itype)) {
        pBVar5 = pBVar5 + 1;
        goto LAB_00450625;
      }
      lVar8 = lVar8 + -1;
      pBVar5 = pBVar5 + 4;
    } while (1 < lVar8);
    lVar8 = (long)pBVar4 - (long)(pBVar6 + lVar7 * 4);
    pBVar6 = pBVar6 + lVar7 * 4;
  }
  lVar7 = (lVar8 >> 2) * 0x6db6db6db6db6db7;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      if (lVar7 != 3) {
        return this;
      }
      pBVar5 = pBVar6;
      if ((((pBVar6->bigend).vect[0] < (pBVar6->smallend).vect[0]) ||
          ((pBVar6->bigend).vect[1] < (pBVar6->smallend).vect[1])) ||
         (((pBVar6->bigend).vect[2] < (pBVar6->smallend).vect[2] || (7 < (pBVar6->btype).itype))))
      goto LAB_00450625;
      pBVar6 = pBVar6 + 1;
    }
    pBVar5 = pBVar6;
    if ((((pBVar6->bigend).vect[0] < (pBVar6->smallend).vect[0]) ||
        ((pBVar6->bigend).vect[1] < (pBVar6->smallend).vect[1])) ||
       (((pBVar6->bigend).vect[2] < (pBVar6->smallend).vect[2] || (7 < (pBVar6->btype).itype))))
    goto LAB_00450625;
    pBVar6 = pBVar6 + 1;
  }
  pBVar5 = pBVar6;
  if (((((pBVar6->smallend).vect[0] <= (pBVar6->bigend).vect[0]) &&
       ((pBVar6->smallend).vect[1] <= (pBVar6->bigend).vect[1])) &&
      ((pBVar6->smallend).vect[2] <= (pBVar6->bigend).vect[2])) && ((pBVar6->btype).itype < 8)) {
    pBVar5 = pBVar4;
  }
LAB_00450625:
  pBVar6 = pBVar5 + 1;
  if (pBVar6 != pBVar4 && pBVar5 != pBVar4) {
    do {
      if ((((pBVar6->smallend).vect[0] <= (pBVar6->bigend).vect[0]) &&
          ((pBVar6->smallend).vect[1] <= (pBVar6->bigend).vect[1])) &&
         (((pBVar6->smallend).vect[2] <= (pBVar6->bigend).vect[2] && ((pBVar6->btype).itype < 8))))
      {
        uVar1 = *(undefined8 *)(pBVar6->smallend).vect;
        uVar2 = *(undefined8 *)((pBVar6->smallend).vect + 2);
        uVar3 = *(undefined8 *)((pBVar6->bigend).vect + 2);
        *(undefined8 *)(pBVar5->bigend).vect = *(undefined8 *)(pBVar6->bigend).vect;
        *(undefined8 *)((pBVar5->bigend).vect + 2) = uVar3;
        *(undefined8 *)(pBVar5->smallend).vect = uVar1;
        *(undefined8 *)((pBVar5->smallend).vect + 2) = uVar2;
        pBVar5 = pBVar5 + 1;
      }
      pBVar6 = pBVar6 + 1;
    } while (pBVar6 != pBVar4);
    pBVar4 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if (pBVar5 != pBVar4) {
    (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish = pBVar5;
  }
  return this;
}

Assistant:

BoxList&
BoxList::removeEmpty()
{
    m_lbox.erase(std::remove_if(m_lbox.begin(), m_lbox.end(),
                                [](const Box& x) { return x.isEmpty(); }),
                 m_lbox.end());
    return *this;
}